

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IteratorHelper.cpp
# Opt level: O0

uint64_t anon_unknown.dwarf_f53e7::getPrevDist(uint64_t n,uint64_t dist)

{
  double *pdVar1;
  uint64_t uVar2;
  unsigned_long *puVar3;
  unsigned_long in_RSI;
  undefined8 in_RDI;
  double dVar4;
  undefined1 auVar5 [16];
  uint64_t defaultDist;
  uint64_t tinyDist;
  uint64_t maxDist;
  uint64_t minDist;
  double logx;
  double x;
  ulong local_48;
  unsigned_long local_40;
  unsigned_long local_38;
  unsigned_long local_30;
  double local_28;
  double local_20;
  double local_18;
  unsigned_long local_10 [2];
  
  auVar5._8_4_ = (int)((ulong)in_RDI >> 0x20);
  auVar5._0_8_ = in_RDI;
  auVar5._12_4_ = 0x45300000;
  local_18 = (auVar5._8_8_ - 1.9342813113834067e+25) +
             ((double)CONCAT44(0x43300000,(int)in_RDI) - 4503599627370496.0);
  local_20 = 10.0;
  local_10[0] = in_RSI;
  pdVar1 = std::max<double>(&local_18,&local_20);
  local_18 = *pdVar1;
  dVar4 = log(local_18);
  local_28 = ceil(dVar4);
  local_30 = ((long)local_28 | (long)(local_28 - 9.223372036854776e+18) & (long)local_28 >> 0x3f) *
             0x100000;
  local_38 = ((long)local_28 | (long)(local_28 - 9.223372036854776e+18) & (long)local_28 >> 0x3f) *
             0x8000000;
  uVar2 = primesieve::PrimeGenerator::maxCachedPrime();
  local_40 = uVar2 << 2;
  dVar4 = sqrt(local_18);
  local_48 = (ulong)(dVar4 + dVar4);
  local_48 = local_48 | (long)((dVar4 + dVar4) - 9.223372036854776e+18) & (long)local_48 >> 0x3f;
  local_10[0] = local_10[0] << 2;
  puVar3 = std::max<unsigned_long>(local_10,&local_40);
  local_10[0] = *puVar3;
  puVar3 = std::min<unsigned_long>(local_10,&local_30);
  local_10[0] = *puVar3;
  puVar3 = std::max<unsigned_long>(local_10,&local_48);
  local_10[0] = *puVar3;
  puVar3 = std::min<unsigned_long>(local_10,&local_38);
  return *puVar3;
}

Assistant:

uint64_t getPrevDist(uint64_t n, uint64_t dist)
{
  double x = (double) n;
  x = max(x, 10.0);
  double logx = ceil(log(x));

  uint64_t minDist = config::MIN_CACHE_ITERATOR;
  uint64_t maxDist = config::MAX_CACHE_ITERATOR;
  minDist /= sizeof(uint64_t);
  maxDist /= sizeof(uint64_t);
  minDist *= (uint64_t) logx;
  maxDist *= (uint64_t) logx;

  uint64_t tinyDist = PrimeGenerator::maxCachedPrime() * 4;
  uint64_t defaultDist = (uint64_t) (sqrt(x) * 2);

  dist *= 4;
  dist = max(dist, tinyDist);
  dist = min(dist, minDist);
  dist = max(dist, defaultDist);
  dist = min(dist, maxDist);

  return dist;
}